

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsoncpp.cpp
# Opt level: O2

Members * __thiscall
Json::Value::getMemberNames_abi_cxx11_(Members *__return_storage_ptr__,Value *this)

{
  ObjectValues *pOVar1;
  _Base_ptr p_Var2;
  ostringstream oss;
  string local_1c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a0 [11];
  
  if (this->field_0x8 == '\0') {
    (__return_storage_ptr__->
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (__return_storage_ptr__->
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    (__return_storage_ptr__->
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  }
  else {
    if (this->field_0x8 != '\a') {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a0);
      std::operator<<((ostream *)local_1a0,
                      "in Json::Value::getMemberNames(), value must be objectValue");
      std::__cxx11::stringbuf::str();
      throwLogicError(&local_1c0);
    }
    (__return_storage_ptr__->
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    (__return_storage_ptr__->
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (__return_storage_ptr__->
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::reserve(__return_storage_ptr__,
              (((this->value_).map_)->_M_t)._M_impl.super__Rb_tree_header._M_node_count);
    pOVar1 = (this->value_).map_;
    for (p_Var2 = (pOVar1->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
        (_Rb_tree_header *)p_Var2 != &(pOVar1->_M_t)._M_impl.super__Rb_tree_header;
        p_Var2 = (_Base_ptr)std::_Rb_tree_increment(p_Var2)) {
      local_1a0[0]._M_dataplus._M_p = (pointer)&local_1a0[0].field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_1a0,*(long *)(p_Var2 + 1),
                 (ulong)(*(uint *)&p_Var2[1]._M_parent >> 2) + *(long *)(p_Var2 + 1));
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                 __return_storage_ptr__,local_1a0);
      std::__cxx11::string::~string((string *)local_1a0);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

Value::Members Value::getMemberNames() const {
  JSON_ASSERT_MESSAGE(
      type_ == nullValue || type_ == objectValue,
      "in Json::Value::getMemberNames(), value must be objectValue");
  if (type_ == nullValue)
    return Value::Members();
  Members members;
  members.reserve(value_.map_->size());
  ObjectValues::const_iterator it = value_.map_->begin();
  ObjectValues::const_iterator itEnd = value_.map_->end();
  for (; it != itEnd; ++it) {
    members.push_back(JSONCPP_STRING((*it).first.data(),
                                  (*it).first.length()));
  }
  return members;
}